

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manageonesuperblock.h
# Opt level: O2

SuperblockType * __thiscall
Hoard::
ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>
::get(ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>
      *this)

{
  SuperblockType *s_00;
  BlockType *pBVar1;
  int iVar2;
  SuperblockType *s;
  long lVar3;
  
  s = this->_current;
  if (this->_current != (SuperblockType *)0x0) {
    this->_current = (SuperblockType *)0x0;
    return s;
  }
  lVar3 = 0;
  do {
    if (lVar3 == 9) {
      return (SuperblockType *)0x0;
    }
    while (s_00 = (this->
                  super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
                  )._available._item[lVar3], s_00 != (SuperblockType *)0x0) {
      pBVar1 = (s_00->_header).
               super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._next;
      (this->
      super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
      )._available._item[lVar3] = pBVar1;
      if (pBVar1 != (BlockType *)0x0) {
        (pBVar1->_header).
        super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>._prev =
             (BlockType *)0x0;
      }
      (s_00->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
      _prev = (BlockType *)0x0;
      (s_00->_header).super_HoardSuperblockHeaderHelper<HL::SpinLockType,_262144,_Hoard::SmallHeap>.
      _next = (BlockType *)0x0;
      iVar2 = EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
              ::getFullness(s_00);
      if (iVar2 <= lVar3) {
        return s_00;
      }
      EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
      ::put(&this->
             super_EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>
            ,s_00);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

SuperblockType * get() {
      if (likely(_current)) {
	SuperblockType * s = _current;
	_current = nullptr;
	return s;
      } else {
	// There's none cached, so just get one from the superheap.
	return SuperHeap::get();
      }
    }